

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O0

void __thiscall Assimp::JSONWriter::Key(JSONWriter *this,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *name_local;
  JSONWriter *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  AddIndentation(this);
  Delimit(this);
  std::operator+(&local_58,'\"',local_18);
  std::operator+(&local_38,&local_58,"\": ");
  std::operator<<((ostream *)&this->field_0x58,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void Key(const std::string& name) {
        AddIndentation();
        Delimit();
        buff << '\"' + name + "\": ";
    }